

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

_Bool chck_buffer_read_string_of_type(char **str,size_t *out_len,chck_bits bits,chck_buffer *buf)

{
  _Bool _Var1;
  char *dst;
  size_t sVar2;
  anon_union_8_5_86cd706a_for_chck_variant_0 memb;
  chck_variant v;
  
  if ((str == (char **)0x0) || (buf == (chck_buffer *)0x0)) {
    __assert_fail("buf && str",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                  ,0x131,
                  "_Bool chck_buffer_read_string_of_type(char **, size_t *, enum chck_bits, struct chck_buffer *)"
                 );
  }
  *str = (char *)0x0;
  if (out_len != (size_t *)0x0) {
    *out_len = 0;
  }
  v.field_0.u64 = 0;
  v.bits = bits;
  _Var1 = chck_buffer_read_int(&v,bits,buf);
  if (_Var1) {
    memb = v.field_0;
    switch(v.bits) {
    case CHCK_BUFFER_B8:
      memb.u64 = v.field_0.u64 & 0xff;
      break;
    case CHCK_BUFFER_B16:
      memb.u64 = v.field_0.u64 & 0xffff;
      break;
    default:
      __assert_fail("0 && \"should not happen\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/buffer/buffer.c"
                    ,0x45,"uintmax_t variant_get_value(struct chck_variant)");
    case CHCK_BUFFER_B32:
      memb.u64 = v.field_0.u64 & 0xffffffff;
      break;
    case CHCK_BUFFER_B64:
      break;
    }
    if (out_len != (size_t *)0x0) {
      *out_len = (size_t)memb;
    }
    if (memb.u64 == 0) {
      return true;
    }
    if (memb.u64 + 1 == 0) {
      *str = (char *)0x0;
    }
    else {
      dst = (char *)calloc(1,memb.u64 + 1);
      *str = dst;
      if (dst != (char *)0x0) {
        sVar2 = chck_buffer_read(dst,1,memb.u64,buf);
        if (sVar2 == memb.u64) {
          return true;
        }
        free(*str);
      }
    }
  }
  return false;
}

Assistant:

bool
chck_buffer_read_string_of_type(char **str, size_t *out_len, enum chck_bits bits, struct chck_buffer *buf)
{
   assert(buf && str);
   *str = NULL;

   if (out_len)
      *out_len = 0;

   struct chck_variant v = { .bits = bits };
   if (unlikely(!chck_buffer_read_int(v.b, bits, buf)))
      return false;

   const size_t len = variant_get_value(v);

   if (out_len)
      *out_len = len;

   if (len <= 0)
      return true;

   if (!(*str = chck_calloc_add_of(len, 1)))
      return false;

   if (unlikely(chck_buffer_read(*str, 1, len, buf) != len)) {
      free(*str);
      return false;
   }

   return true;
}